

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O3

void anon_unknown.dwarf_3e8f::test_iterator_advance(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *r;
  roaring64_iterator_t *it;
  uint64_t uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  uint64_t v;
  roaring64_bulk_context_t context;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  unsigned_long local_40;
  roaring64_bulk_context_t local_38;
  
  r = roaring64_bitmap_create();
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_58,1000);
  local_38.high_bytes[0] = '\0';
  local_38.high_bytes[1] = '\0';
  local_38.high_bytes[2] = '\0';
  local_38.high_bytes[3] = '\0';
  local_38.high_bytes[4] = '\0';
  local_38.high_bytes[5] = '\0';
  local_38._6_2_ = 0;
  local_38.leaf = (roaring64_leaf_t *)0x0;
  uVar3 = 0;
  do {
    local_40 = uVar3;
    if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_58,
                 (iterator)
                 local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_40);
    }
    else {
      *local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish = uVar3;
      local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    roaring64_bitmap_add_bulk(r,&local_38,local_40);
    uVar3 = uVar3 + 10000;
  } while (uVar3 != 10000000);
  it = roaring64_iterator_create(r);
  uVar3 = 0;
  do {
    uVar4 = uVar3;
    uVar2 = roaring64_iterator_value(it);
    _assert_int_equal(uVar2,local_58.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar4],
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                      ,0x6f1);
    _Var1 = roaring64_iterator_advance(it);
    uVar3 = uVar4 + 1;
  } while (_Var1);
  _assert_int_equal(uVar4 + 1,
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x6f4);
  _Var1 = roaring64_iterator_previous(it);
  _assert_true((ulong)_Var1,"roaring64_iterator_previous(it)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x6f7);
  uVar2 = roaring64_iterator_value(it);
  _assert_int_equal(uVar2,local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4],
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x6f9);
  _Var1 = roaring64_iterator_advance(it);
  _assert_true((ulong)!_Var1,"roaring64_iterator_advance(it)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x6fc);
  roaring64_iterator_free(it);
  roaring64_bitmap_free(r);
  if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

DEFINE_TEST(test_iterator_advance) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    std::vector<uint64_t> values;
    values.reserve(1000);
    roaring64_bulk_context_t context{};
    for (uint64_t i = 0; i < 1000; ++i) {
        uint64_t v = i * 10000;
        values.push_back(v);
        roaring64_bitmap_add_bulk(r, &context, v);
    }
    size_t i = 0;
    roaring64_iterator_t* it = roaring64_iterator_create(r);
    do {
        assert_int_equal(roaring64_iterator_value(it), values[i]);
        i++;
    } while (roaring64_iterator_advance(it));
    assert_int_equal(i, values.size());

    // Check that we can move backward from after the last entry.
    assert_true(roaring64_iterator_previous(it));
    i--;
    assert_int_equal(roaring64_iterator_value(it), values[i]);

    // Check that we can't move forward again.
    assert_false(roaring64_iterator_advance(it));

    roaring64_iterator_free(it);
    roaring64_bitmap_free(r);
}